

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O3

leaf_type_help * __thiscall
tcmalloc::FixedAllocator<tcmalloc::PageMap::leaf_type_help>::AllocFromArea
          (FixedAllocator<tcmalloc::PageMap::leaf_type_help> *this)

{
  leaf_type_help *plVar1;
  uint64_t uVar2;
  
  if (this->area_free_ < 0x800000) {
    plVar1 = (leaf_type_help *)mmap((void *)0x0,0x8000000,3,0x22,-1,0);
    if (plVar1 == (leaf_type_help *)0xffffffffffffffff) {
      return (leaf_type_help *)0x0;
    }
    uVar2 = 0x7800000;
  }
  else {
    plVar1 = (leaf_type_help *)this->area_;
    uVar2 = this->area_free_ - 0x800000;
  }
  this->area_ = (char *)(plVar1 + 1);
  this->area_free_ = uVar2;
  return plVar1;
}

Assistant:

T *AllocFromArea() {
        if (area_free_ < sizeof(T)) {
            void *ptr = SystemAlloc(areaSize_);
            if (ptr == (void *) (-1)) {
                return nullptr;
            }
            area_ = (char *) ptr;
            area_free_ = areaSize_;
        }
        void *result = area_;
        area_ += sizeof(T);
        area_free_ -= sizeof(T);
        return reinterpret_cast<T *>(result);
    }